

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RollupOutput::PrintRowToCSV
          (RollupOutput *this,RollupRow *row,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parent_labels,ostream *out,bool tabs,bool csvDiff)

{
  ostream *poVar1;
  char *__s;
  undefined7 in_register_00000081;
  char *pcVar2;
  undefined3 in_register_00000089;
  string_view separator;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_60;
  undefined4 local_5c;
  ostream *local_58;
  string local_50;
  
  local_5c = CONCAT31(in_register_00000089,csvDiff);
  pcVar2 = (char *)CONCAT71(in_register_00000081,tabs);
  local_60 = SUB84(pcVar2,0);
  local_58 = out;
  while ((ulong)((long)(parent_labels->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(parent_labels->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) <
         (ulong)((long)(this->source_names_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->source_names_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,anon_var_dwarf_377060 + 0x11,(allocator<char> *)&local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::to_string(&local_80,(row->size).vm);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::to_string(&local_80,(row->size).file);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if ((char)local_5c != '\0') {
    std::__cxx11::to_string(&local_80,(row->old_size).vm);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::to_string(&local_80,(row->old_size).file);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::to_string(&local_80,(row->size).vm + (row->old_size).vm);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::to_string(&local_80,(row->size).file + (row->old_size).file);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)parent_labels,
               &local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  __s = ",";
  if ((char)local_60 != '\0') {
    __s = anon_var_dwarf_2e78af + 0x11;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,__s,(allocator<char> *)&local_50);
  separator._M_str = pcVar2;
  separator._M_len = (size_t)local_80._M_dataplus._M_p;
  absl::strings_internal::
  JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_50,(strings_internal *)parent_labels,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_80._M_string_length,separator);
  poVar1 = std::operator<<(local_58,(string *)&local_50);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void RollupOutput::PrintRowToCSV(const RollupRow& row,
                                 std::vector<std::string> parent_labels,
                                 std::ostream* out, bool tabs, bool csvDiff) const {
  while (parent_labels.size() < source_names_.size()) {
    // If this label had no data at this level, append an empty string.
    parent_labels.push_back("");
  }

  parent_labels.push_back(std::to_string(row.size.vm));
  parent_labels.push_back(std::to_string(row.size.file));

  // If in diff where both old size are 0, get new size by adding diff size to
  // old size.
  if (csvDiff) {
    parent_labels.push_back(std::to_string(row.old_size.vm));
  	parent_labels.push_back(std::to_string(row.old_size.file));
    parent_labels.push_back(std::to_string(row.old_size.vm + (row.size.vm)));
    parent_labels.push_back(
        std::to_string(row.old_size.file + (row.size.file)));}

  std::string sep = tabs ? "\t" : ",";
  *out << absl::StrJoin(parent_labels, sep) << "\n";
}